

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextGLImpl::PrepareForIndexedDraw
          (DeviceContextGLImpl *this,VALUE_TYPE IndexType,Uint32 FirstIndexLocation,
          GLenum *GLIndexType,size_t *FirstIndexByteOffset)

{
  GLenum GVar1;
  uint uVar2;
  char (*Args_1) [35];
  string msg;
  string local_50;
  
  if (VT_FLOAT64 < IndexType) {
    FormatString<char[26],char[34]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Value < _countof(TypeToGLTypeMap)",(char (*) [34])GLIndexType);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"TypeToGLType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x66);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  GVar1 = *(GLenum *)(TypeToGLType(Diligent::VALUE_TYPE)::TypeToGLTypeMap + (ulong)IndexType * 4);
  *GLIndexType = GVar1;
  uVar2 = GVar1 - 0x1401;
  if ((4 < uVar2) || (Args_1 = (char (*) [35])0x15, (0x15U >> (uVar2 & 0x1f) & 1) == 0)) {
    FormatString<char[23]>(&local_50,(char (*) [23])"Unsupported index type");
    Args_1 = (char (*) [35])0x34c;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"PrepareForIndexedDraw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x34c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pIndexBuffer.m_pObject ==
      (BufferGLImpl *)0x0) {
    FormatString<char[42]>(&local_50,(char (*) [42])"Index Buffer is not bound to the pipeline");
    Args_1 = (char (*) [35])0x34d;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"PrepareForIndexedDraw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x34d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (VT_FLOAT64 < IndexType) {
    FormatString<char[26],char[35]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Val < _countof(ValueTypeToSizeMap)",Args_1);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetValueSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/GraphicsAccessories.hpp"
               ,0xa6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  *FirstIndexByteOffset =
       (ulong)FirstIndexLocation * (ulong)*(uint *)(ValueTypeToSizeMap + (ulong)IndexType * 4) +
       (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_IndexDataStartOffset;
  return;
}

Assistant:

void DeviceContextGLImpl::PrepareForIndexedDraw(VALUE_TYPE IndexType, Uint32 FirstIndexLocation, GLenum& GLIndexType, size_t& FirstIndexByteOffset)
{
    GLIndexType = TypeToGLType(IndexType);
    VERIFY(GLIndexType == GL_UNSIGNED_BYTE || GLIndexType == GL_UNSIGNED_SHORT || GLIndexType == GL_UNSIGNED_INT,
           "Unsupported index type");
    VERIFY(m_pIndexBuffer, "Index Buffer is not bound to the pipeline");
    FirstIndexByteOffset = StaticCast<size_t>(GetValueSize(IndexType) * Uint64{FirstIndexLocation} + m_IndexDataStartOffset);
}